

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_adjacency_subgraph.cpp
# Opt level: O1

void __thiscall Adjacency_Subgraph_resize_Test::TestBody(Adjacency_Subgraph_resize_Test *this)

{
  Adjacency_Graph<false> *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_02;
  size_t sVar1;
  pointer puVar2;
  char *pcVar3;
  char *pcVar4;
  pointer *__ptr;
  pointer *__ptr_2;
  initializer_list<std::pair<unsigned_long,_unsigned_long>_> edge_graph;
  initializer_list<unsigned_long> __l;
  initializer_list<unsigned_long> __l_00;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  size_t size_edge;
  Adjacency_Graph<false> graph;
  Adjacency_Subgraph subgraph;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_2f0;
  undefined1 local_2d8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_2d0;
  pointer local_2c8;
  undefined8 uStack_2c0;
  undefined8 local_2b8;
  AssertHelper local_2b0;
  undefined1 local_2a8 [8];
  undefined1 auStack_2a0 [24];
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_288;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_270;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_258;
  ulong local_238;
  Adjacency_Graph<false> local_230;
  Adjacency_Subgraph local_200;
  undefined8 local_198;
  undefined8 local_190;
  undefined8 local_188;
  undefined8 local_180;
  undefined8 local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 local_160;
  undefined8 local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 local_140;
  undefined8 local_138;
  undefined8 local_130;
  undefined8 local_128;
  undefined8 local_120;
  undefined8 local_118;
  undefined8 local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 local_f8;
  undefined8 local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  undefined8 local_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  undefined8 local_80;
  undefined8 local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined8 local_30;
  undefined8 local_28;
  
  local_200.hash_parent = 0;
  local_200.graph.vertex_adjacent_list.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&DAT_00000006;
  local_200.graph.vertex_adjacent_list.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_200.graph.vertex_adjacent_list.
  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)&DAT_00000008;
  local_200.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  local_200.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)&DAT_00000007;
  local_200.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x1;
  local_200.i_local_global.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_start = (pointer)&DAT_00000008;
  local_200.i_local_global.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)0x1;
  local_200.i_local_global.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_0000000a;
  local_200.level_set_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x1;
  local_200.level_set_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0xc;
  local_200.level_set_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x2;
  local_198 = 6;
  local_190 = 2;
  local_188 = 7;
  local_180 = 2;
  local_178 = 9;
  local_170 = 3;
  pcVar4 = (char *)0xb;
  local_168 = 0xb;
  local_160 = 3;
  local_158 = 0xc;
  local_150 = 3;
  local_148 = 0xe;
  local_140 = 4;
  local_138 = 9;
  local_130 = 4;
  local_128 = 10;
  local_120 = 4;
  local_118 = 0xb;
  local_110 = 4;
  local_108 = 0xd;
  local_100 = 5;
  local_f8 = 0xd;
  local_f0 = 5;
  local_e8 = 0xe;
  local_e0 = 6;
  local_d8 = 7;
  local_d0 = 6;
  local_c8 = 8;
  local_c0 = 7;
  local_b8 = 8;
  local_b0 = 7;
  local_a8 = 9;
  local_a0 = 7;
  local_98 = 10;
  local_90 = 9;
  local_88 = 10;
  local_80 = 10;
  local_78 = 0xb;
  local_70 = 10;
  local_68 = 0xc;
  local_60 = 0xb;
  local_58 = 0xc;
  local_50 = 0xb;
  local_48 = 0xd;
  local_40 = 0xb;
  local_38 = 0xe;
  local_30 = 0xd;
  local_28 = 0xe;
  edge_graph._M_len = 0x1e;
  edge_graph._M_array = (iterator)&local_200;
  Disa::Adjacency_Graph<false>::Adjacency_Graph(&local_230,edge_graph);
  auStack_2a0._8_8_ = &DAT_00000008;
  auStack_2a0._16_8_ = (pointer)0xd;
  local_2a8 = (undefined1  [8])0x0;
  auStack_2a0._0_8_ = &DAT_00000006;
  local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0xe;
  __l._M_len = 5;
  __l._M_array = (iterator)local_2a8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8,__l,
             (allocator_type *)&local_2f0);
  Disa::Adjacency_Subgraph::Adjacency_Subgraph
            (&local_200,&local_230,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)local_2d8,0);
  if ((_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )local_2d8 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  {
    operator_delete((void *)local_2d8,(long)local_2c8 - (long)local_2d8);
  }
  this_00 = &local_200.graph;
  local_238 = (ulong)((long)local_200.graph.vertex_adjacent_list.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_finish -
                      (long)local_200.graph.vertex_adjacent_list.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start >> 3) >> 1;
  local_2d8 = (undefined1  [8])0x7;
  if (((long)local_200.graph.offset.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_200.graph.offset.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start == 0) ||
     (((long)local_200.graph.offset.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_200.graph.offset.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) - 1U < 7)) {
    local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_2a0._8_8_ = (pointer)0x0;
    auStack_2a0._16_8_ = (pointer)0x0;
    local_2a8 = (undefined1  [8])0x0;
    auStack_2a0._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_200.hash_parent =
         std::hash<Disa::Adjacency_Graph<false>_>::operator()
                   ((hash<Disa::Adjacency_Graph<false>_> *)&local_2f0,
                    (Adjacency_Graph<false> *)local_2a8);
    Disa::Adjacency_Graph<false>::~Adjacency_Graph((Adjacency_Graph<false> *)local_2a8);
  }
  Disa::Adjacency_Graph<false>::resize(this_00,(size_t *)local_2d8);
  this_01 = &local_200.i_local_global;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_01,(size_type)local_2d8);
  this_02 = &local_200.level_set_value;
  if (local_200.level_set_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_200.level_set_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_02,(size_type)local_2d8)
    ;
  }
  sVar1 = std::hash<Disa::Adjacency_Graph<false>_>::operator()
                    ((hash<Disa::Adjacency_Graph<false>_> *)local_2a8,&local_230);
  local_2d8[0] = sVar1 != local_200.hash_parent;
  pbStack_2d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (sVar1 == local_200.hash_parent) {
    testing::Message::Message((Message *)&local_2f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2a8,(internal *)local_2d8,
               (AssertionResult *)"subgraph.is_parent(graph)","true","false",pcVar4);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xe5,(char *)local_2a8);
    testing::internal::AssertHelper::operator=(&local_2b0,(Message *)&local_2f0);
    testing::internal::AssertHelper::~AssertHelper(&local_2b0);
    if (local_2a8 != (undefined1  [8])(auStack_2a0 + 8)) {
      operator_delete((void *)local_2a8,(ulong)(auStack_2a0._8_8_ + 1));
    }
    if (local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (pbStack_2d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2d0,pbStack_2d0);
  }
  local_2d8 = (undefined1  [8])
              (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )0x0;
  if (local_200.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_200.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_2d8 = (undefined1  [8])
                (((long)local_200.graph.offset.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_200.graph.offset.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) + -1);
  }
  local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,7);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2a8,"subgraph.size_vertex()","7",(unsigned_long *)local_2d8,
             (int *)&local_2f0);
  if (local_2a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((_Alloc_hider *)auStack_2a0._0_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xe6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f0,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f0);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_2a0._0_8_);
  }
  local_2d8 = (undefined1  [8])
              ((ulong)((long)local_200.graph.vertex_adjacent_list.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_200.graph.vertex_adjacent_list.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) >> 1);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_2a8,"subgraph.size_edge()","size_edge",(unsigned_long *)local_2d8,
             &local_238);
  if (local_2a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((_Alloc_hider *)auStack_2a0._0_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xe7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f0,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f0);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_2a0._0_8_);
  }
  local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8 = (undefined1  [8])
              Disa::Adjacency_Subgraph::local_global(&local_200,(size_t *)&local_2f0);
  local_2b0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2a8,"subgraph.local_global(0)","0",(unsigned_long *)local_2d8,
             (int *)&local_2b0);
  if (local_2a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((_Alloc_hider *)auStack_2a0._0_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xe8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f0,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f0);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_2a0._0_8_);
  }
  local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  local_2d8 = (undefined1  [8])
              Disa::Adjacency_Subgraph::local_global(&local_200,(size_t *)&local_2f0);
  local_2b0.data_._0_4_ = 6;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2a8,"subgraph.local_global(1)","6",(unsigned_long *)local_2d8,
             (int *)&local_2b0);
  if (local_2a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((_Alloc_hider *)auStack_2a0._0_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xe9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f0,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f0);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_2a0._0_8_);
  }
  local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x2;
  local_2d8 = (undefined1  [8])
              Disa::Adjacency_Subgraph::local_global(&local_200,(size_t *)&local_2f0);
  local_2b0.data_._0_4_ = 8;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2a8,"subgraph.local_global(2)","8",(unsigned_long *)local_2d8,
             (int *)&local_2b0);
  if (local_2a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((_Alloc_hider *)auStack_2a0._0_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xea,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f0,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f0);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_2a0._0_8_);
  }
  local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3;
  local_2d8 = (undefined1  [8])
              Disa::Adjacency_Subgraph::local_global(&local_200,(size_t *)&local_2f0);
  local_2b0.data_._0_4_ = 0xd;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2a8,"subgraph.local_global(3)","13",(unsigned_long *)local_2d8,
             (int *)&local_2b0);
  if (local_2a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((_Alloc_hider *)auStack_2a0._0_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xeb,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f0,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f0);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_2a0._0_8_);
  }
  local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x4;
  local_2d8 = (undefined1  [8])
              Disa::Adjacency_Subgraph::local_global(&local_200,(size_t *)&local_2f0);
  local_2b0.data_._0_4_ = 0xe;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2a8,"subgraph.local_global(4)","14",(unsigned_long *)local_2d8,
             (int *)&local_2b0);
  if (local_2a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((_Alloc_hider *)auStack_2a0._0_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xec,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f0,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f0);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_2a0._0_8_);
  }
  local_2c8 = (pointer)&DAT_00000008;
  uStack_2c0 = 0xd;
  local_2d8 = (undefined1  [8])0x0;
  pbStack_2d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&DAT_00000006;
  local_2b8 = 0xe;
  __l_00._M_len = 5;
  __l_00._M_array = (iterator)local_2d8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&local_2f0,__l_00,(allocator_type *)&local_2b0);
  Disa::Adjacency_Subgraph::Adjacency_Subgraph
            ((Adjacency_Subgraph *)local_2a8,&local_230,&local_2f0,0);
  local_200.hash_parent = (size_t)local_2a8;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&this_00->vertex_adjacent_list,
             (vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_2a0);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=
            (&local_200.graph.offset,&local_288);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(this_01,&local_270);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::operator=(this_02,&local_258);
  Disa::Adjacency_Subgraph::~Adjacency_Subgraph((Adjacency_Subgraph *)local_2a8);
  if (local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_2f0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2f0.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  local_2d8 = (undefined1  [8])0x5;
  if (((long)local_200.graph.offset.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_200.graph.offset.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start == 0) ||
     (((long)local_200.graph.offset.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_200.graph.offset.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) - 1U < 5)) {
    local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_2a0._8_8_ = (pointer)0x0;
    auStack_2a0._16_8_ = (pointer)0x0;
    local_2a8 = (undefined1  [8])0x0;
    auStack_2a0._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_200.hash_parent =
         std::hash<Disa::Adjacency_Graph<false>_>::operator()
                   ((hash<Disa::Adjacency_Graph<false>_> *)&local_2f0,
                    (Adjacency_Graph<false> *)local_2a8);
    Disa::Adjacency_Graph<false>::~Adjacency_Graph((Adjacency_Graph<false> *)local_2a8);
  }
  Disa::Adjacency_Graph<false>::resize(this_00,(size_t *)local_2d8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_01,(size_type)local_2d8);
  if (local_200.level_set_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_200.level_set_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_02,(size_type)local_2d8)
    ;
  }
  puVar2 = (pointer)std::hash<Disa::Adjacency_Graph<false>_>::operator()
                              ((hash<Disa::Adjacency_Graph<false>_> *)local_2a8,&local_230);
  local_2d8[0] = puVar2 == (pointer)local_200.hash_parent;
  pbStack_2d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (puVar2 != (pointer)local_200.hash_parent) {
    testing::Message::Message((Message *)&local_2f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2a8,(internal *)local_2d8,
               (AssertionResult *)"subgraph.is_parent(graph)","false","true",pcVar4);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xf3,(char *)local_2a8);
    testing::internal::AssertHelper::operator=(&local_2b0,(Message *)&local_2f0);
    testing::internal::AssertHelper::~AssertHelper(&local_2b0);
    if (local_2a8 != (undefined1  [8])(auStack_2a0 + 8)) {
      operator_delete((void *)local_2a8,(ulong)(auStack_2a0._8_8_ + 1));
    }
    if (local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (pbStack_2d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2d0,pbStack_2d0);
  }
  local_2d8 = (undefined1  [8])
              (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )0x0;
  if (local_200.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_200.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_2d8 = (undefined1  [8])
                (((long)local_200.graph.offset.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_200.graph.offset.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) + -1);
  }
  local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,5);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2a8,"subgraph.size_vertex()","5",(unsigned_long *)local_2d8,
             (int *)&local_2f0);
  if (local_2a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((_Alloc_hider *)auStack_2a0._0_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xf4,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f0,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f0);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_2a0._0_8_);
  }
  local_2d8 = (undefined1  [8])
              ((ulong)((long)local_200.graph.vertex_adjacent_list.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_200.graph.vertex_adjacent_list.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) >> 1);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)local_2a8,"subgraph.size_edge()","size_edge",(unsigned_long *)local_2d8,
             &local_238);
  if (local_2a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((_Alloc_hider *)auStack_2a0._0_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xf5,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f0,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f0);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_2a0._0_8_);
  }
  local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8 = (undefined1  [8])
              Disa::Adjacency_Subgraph::local_global(&local_200,(size_t *)&local_2f0);
  local_2b0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2a8,"subgraph.local_global(0)","0",(unsigned_long *)local_2d8,
             (int *)&local_2b0);
  if (local_2a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((_Alloc_hider *)auStack_2a0._0_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xf6,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f0,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f0);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_2a0._0_8_);
  }
  local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  local_2d8 = (undefined1  [8])
              Disa::Adjacency_Subgraph::local_global(&local_200,(size_t *)&local_2f0);
  local_2b0.data_._0_4_ = 6;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2a8,"subgraph.local_global(1)","6",(unsigned_long *)local_2d8,
             (int *)&local_2b0);
  if (local_2a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((_Alloc_hider *)auStack_2a0._0_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xf7,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f0,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f0);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_2a0._0_8_);
  }
  local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x2;
  local_2d8 = (undefined1  [8])
              Disa::Adjacency_Subgraph::local_global(&local_200,(size_t *)&local_2f0);
  local_2b0.data_._0_4_ = 8;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2a8,"subgraph.local_global(2)","8",(unsigned_long *)local_2d8,
             (int *)&local_2b0);
  if (local_2a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((_Alloc_hider *)auStack_2a0._0_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xf8,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f0,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f0);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_2a0._0_8_);
  }
  local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x3;
  local_2d8 = (undefined1  [8])
              Disa::Adjacency_Subgraph::local_global(&local_200,(size_t *)&local_2f0);
  local_2b0.data_._0_4_ = 0xd;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2a8,"subgraph.local_global(3)","13",(unsigned_long *)local_2d8,
             (int *)&local_2b0);
  if (local_2a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((_Alloc_hider *)auStack_2a0._0_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xf9,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f0,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f0);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_2a0._0_8_);
  }
  local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x4;
  local_2d8 = (undefined1  [8])
              Disa::Adjacency_Subgraph::local_global(&local_200,(size_t *)&local_2f0);
  local_2b0.data_._0_4_ = 0xe;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2a8,"subgraph.local_global(4)","14",(unsigned_long *)local_2d8,
             (int *)&local_2b0);
  if (local_2a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((_Alloc_hider *)auStack_2a0._0_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xfa,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f0,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f0);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_2a0._0_8_);
  }
  local_2d8 = (undefined1  [8])0x3;
  if (((long)local_200.graph.offset.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_200.graph.offset.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start == 0) ||
     (((long)local_200.graph.offset.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)local_200.graph.offset.
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) - 1U < 3)) {
    local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_288.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    auStack_2a0._8_8_ = (pointer)0x0;
    auStack_2a0._16_8_ = (pointer)0x0;
    local_2a8 = (undefined1  [8])0x0;
    auStack_2a0._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    local_200.hash_parent =
         std::hash<Disa::Adjacency_Graph<false>_>::operator()
                   ((hash<Disa::Adjacency_Graph<false>_> *)&local_2f0,
                    (Adjacency_Graph<false> *)local_2a8);
    Disa::Adjacency_Graph<false>::~Adjacency_Graph((Adjacency_Graph<false> *)local_2a8);
  }
  Disa::Adjacency_Graph<false>::resize(this_00,(size_t *)local_2d8);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_01,(size_type)local_2d8);
  if (local_200.level_set_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_200.level_set_value.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_02,(size_type)local_2d8)
    ;
  }
  puVar2 = (pointer)std::hash<Disa::Adjacency_Graph<false>_>::operator()
                              ((hash<Disa::Adjacency_Graph<false>_> *)local_2a8,&local_230);
  local_2d8[0] = puVar2 == (pointer)local_200.hash_parent;
  pbStack_2d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (puVar2 != (pointer)local_200.hash_parent) {
    testing::Message::Message((Message *)&local_2f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2a8,(internal *)local_2d8,
               (AssertionResult *)"subgraph.is_parent(graph)","false","true",pcVar4);
    testing::internal::AssertHelper::AssertHelper
              (&local_2b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xfe,(char *)local_2a8);
    testing::internal::AssertHelper::operator=(&local_2b0,(Message *)&local_2f0);
    testing::internal::AssertHelper::~AssertHelper(&local_2b0);
    if (local_2a8 != (undefined1  [8])(auStack_2a0 + 8)) {
      operator_delete((void *)local_2a8,(ulong)(auStack_2a0._8_8_ + 1));
    }
    if (local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      (**(code **)(*local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                    _M_impl.super__Vector_impl_data._M_start + 8))();
    }
  }
  if (pbStack_2d0 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_2d0,pbStack_2d0);
  }
  local_2d8 = (undefined1  [8])
              (_Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
               )0x0;
  if (local_200.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_finish !=
      local_200.graph.offset.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start) {
    local_2d8 = (undefined1  [8])
                (((long)local_200.graph.offset.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_finish -
                  (long)local_200.graph.offset.
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start >> 3) + -1);
  }
  local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,3);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2a8,"subgraph.size_vertex()","3",(unsigned_long *)local_2d8,
             (int *)&local_2f0);
  if (local_2a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)auStack_2a0._0_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0xff,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f0,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f0);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_2a0._0_8_);
  }
  local_2d8 = (undefined1  [8])
              ((ulong)((long)local_200.graph.vertex_adjacent_list.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                       (long)local_200.graph.vertex_adjacent_list.
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start >> 3) >> 1);
  local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)CONCAT44(local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                         ._M_impl.super__Vector_impl_data._M_start._4_4_,3);
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2a8,"subgraph.size_edge()","3",(unsigned_long *)local_2d8,
             (int *)&local_2f0);
  if (local_2a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)auStack_2a0._0_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x100,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f0,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f0);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_2a0._0_8_);
  }
  local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_2d8 = (undefined1  [8])
              Disa::Adjacency_Subgraph::local_global(&local_200,(size_t *)&local_2f0);
  local_2b0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2a8,"subgraph.local_global(0)","0",(unsigned_long *)local_2d8,
             (int *)&local_2b0);
  if (local_2a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)auStack_2a0._0_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x101,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f0,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f0);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_2a0._0_8_);
  }
  local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x1;
  local_2d8 = (undefined1  [8])
              Disa::Adjacency_Subgraph::local_global(&local_200,(size_t *)&local_2f0);
  local_2b0.data_._0_4_ = 6;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2a8,"subgraph.local_global(1)","6",(unsigned_long *)local_2d8,
             (int *)&local_2b0);
  if (local_2a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)auStack_2a0._0_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x102,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f0,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f0);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_2a0._0_8_);
  }
  local_2f0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x2;
  local_2d8 = (undefined1  [8])
              Disa::Adjacency_Subgraph::local_global(&local_200,(size_t *)&local_2f0);
  local_2b0.data_._0_4_ = 8;
  testing::internal::CmpHelperEQ<unsigned_long,int>
            ((internal *)local_2a8,"subgraph.local_global(2)","8",(unsigned_long *)local_2d8,
             (int *)&local_2b0);
  if (local_2a8[0] == (hash<Disa::Adjacency_Graph<false>_>)0x0) {
    testing::Message::Message((Message *)local_2d8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar4 = "";
    }
    else {
      pcVar4 = ((_Alloc_hider *)auStack_2a0._0_8_)->_M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_2f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bevanwsjones[P]Disa/test/graph/test_adjacency_subgraph.cpp"
               ,0x103,pcVar4);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_2f0,(Message *)local_2d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_2f0);
    if (local_2d8 != (undefined1  [8])0x0) {
      (**(code **)(*(unsigned_long *)local_2d8 + 8))();
    }
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)auStack_2a0._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)auStack_2a0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 auStack_2a0._0_8_);
  }
  Disa::Adjacency_Subgraph::~Adjacency_Subgraph(&local_200);
  Disa::Adjacency_Graph<false>::~Adjacency_Graph(&local_230);
  return;
}

Assistant:

TEST(Adjacency_Subgraph, resize) {
  Adjacency_Graph graph = create_graph_saad();
  Adjacency_Subgraph subgraph(graph, {0, 6, 8, 13, 14});
  std::size_t size_edge = subgraph.size_edge();

  // Expand the graph
  subgraph.resize(7);
  EXPECT_FALSE(subgraph.is_parent(graph));
  EXPECT_EQ(subgraph.size_vertex(), 7);
  EXPECT_EQ(subgraph.size_edge(), size_edge);
  EXPECT_EQ(subgraph.local_global(0), 0);
  EXPECT_EQ(subgraph.local_global(1), 6);
  EXPECT_EQ(subgraph.local_global(2), 8);
  EXPECT_EQ(subgraph.local_global(3), 13);
  EXPECT_EQ(subgraph.local_global(4), 14);
  // Vertices after are in an uninitialised state.

  subgraph = Adjacency_Subgraph(graph, {0, 6, 8, 13, 14});

  // Keep the subgraph the same size.
  subgraph.resize(5);
  EXPECT_TRUE(subgraph.is_parent(graph));
  EXPECT_EQ(subgraph.size_vertex(), 5);
  EXPECT_EQ(subgraph.size_edge(), size_edge);
  EXPECT_EQ(subgraph.local_global(0), 0);
  EXPECT_EQ(subgraph.local_global(1), 6);
  EXPECT_EQ(subgraph.local_global(2), 8);
  EXPECT_EQ(subgraph.local_global(3), 13);
  EXPECT_EQ(subgraph.local_global(4), 14);

  // Shrink the subgraph the same size.
  subgraph.resize(3);
  EXPECT_TRUE(subgraph.is_parent(graph));
  EXPECT_EQ(subgraph.size_vertex(), 3);
  EXPECT_EQ(subgraph.size_edge(), 3);
  EXPECT_EQ(subgraph.local_global(0), 0);
  EXPECT_EQ(subgraph.local_global(1), 6);
  EXPECT_EQ(subgraph.local_global(2), 8);
}